

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::getChildPtr
          (ReplicatedAssignmentPatternSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffc0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 1:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RDI + 0x28));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x40),in_stack_ffffffffffffffb8);
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 5:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax ReplicatedAssignmentPatternSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openBrace;
        case 1: return countExpr.get();
        case 2: return &innerOpenBrace;
        case 3: return &items;
        case 4: return &innerCloseBrace;
        case 5: return &closeBrace;
        default: return nullptr;
    }
}